

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O0

int add_file(int argc,char **argv)

{
  char *pcVar1;
  FILE *pFVar2;
  int iVar3;
  ulonglong uVar4;
  longlong lVar5;
  undefined8 uVar6;
  long lVar7;
  zip_int64_t len;
  zip_uint64_t start;
  zip_source_t *zs;
  char **argv_local;
  int argc_local;
  
  uVar4 = strtoull(argv[2],(char **)0x0,10);
  lVar5 = strtoll(argv[3],(char **)0x0,10);
  iVar3 = strcmp(argv[1],"/dev/stdin");
  if (iVar3 == 0) {
    start = zip_source_filep(za,_stdin,uVar4,lVar5);
    pFVar2 = _stderr;
    if (start == 0) {
      uVar6 = zip_strerror(za);
      fprintf(pFVar2,"can\'t create zip_source from stdin: %s\n",uVar6);
      return -1;
    }
  }
  else {
    start = zip_source_file(za,argv[1],uVar4,lVar5);
    pFVar2 = _stderr;
    if (start == 0) {
      uVar6 = zip_strerror(za);
      fprintf(pFVar2,"can\'t create zip_source from file: %s\n",uVar6);
      return -1;
    }
  }
  lVar7 = zip_add(za,*argv,start);
  if (lVar7 == -1) {
    zip_source_free(start);
    pFVar2 = _stderr;
    pcVar1 = *argv;
    uVar6 = zip_strerror(za);
    fprintf(pFVar2,"can\'t add file \'%s\': %s\n",pcVar1,uVar6);
    argv_local._4_4_ = -1;
  }
  else {
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

static int
add_file(int argc, char *argv[]) {
    zip_source_t *zs;
    zip_uint64_t start = strtoull(argv[2], NULL, 10);
    zip_int64_t len = strtoll(argv[3], NULL, 10);

    if (strcmp(argv[1], "/dev/stdin") == 0) {
	if ((zs = zip_source_filep(za, stdin, start, len)) == NULL) {
	    fprintf(stderr, "can't create zip_source from stdin: %s\n", zip_strerror(za));
	    return -1;
	}
    }
    else {
	if ((zs = zip_source_file(za, argv[1], start, len)) == NULL) {
	    fprintf(stderr, "can't create zip_source from file: %s\n", zip_strerror(za));
	    return -1;
	}
    }

    if (zip_add(za, argv[0], zs) == -1) {
	zip_source_free(zs);
	fprintf(stderr, "can't add file '%s': %s\n", argv[0], zip_strerror(za));
	return -1;
    }
    return 0;
}